

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimixup.cpp
# Opt level: O3

void randomizeNotes(vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *notes)

{
  double dVar1;
  pointer ppVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  pointer ppVar6;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *notes_00;
  uint uVar7;
  ulong uVar8;
  size_t __i;
  long lVar9;
  pointer ppVar10;
  pointer ppVar11;
  ulong uVar12;
  __normal_iterator<pairing_*,_std::vector<pairing,_std::allocator<pairing>_>_> __i_1;
  pointer ppVar13;
  size_type __new_size;
  long lVar14;
  double dVar15;
  vector<pairing,_std::allocator<pairing>_> neworder;
  mt19937 md;
  random_device rd;
  vector<pairing,_std::allocator<pairing>_> local_2768;
  size_type local_2750;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *local_2748;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar7 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar7;
  lVar9 = 1;
  uVar8 = local_2740._M_x[0];
  do {
    uVar8 = (ulong)(((uint)(uVar8 >> 0x1e) ^ (uint)uVar8) * 0x6c078965 + (int)lVar9);
    local_2740._M_x[lVar9] = uVar8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x270);
  local_2740._M_p = 0x270;
  __new_size = (long)(notes->super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(notes->super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
  local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<pairing,_std::allocator<pairing>_>::resize(&local_2768,__new_size);
  uVar12 = (long)local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar8 = (long)uVar12 >> 4;
  local_2750 = __new_size;
  local_2748 = notes;
  if (0 < (int)uVar8) {
    lVar9 = 0;
    lVar14 = 0;
    do {
      *(int *)((long)&(local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
                       super__Vector_impl_data._M_start)->index + lVar9) = (int)lVar14;
      dVar15 = std::
               generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_2740);
      *(double *)
       ((long)&(local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
                super__Vector_impl_data._M_start)->value + lVar9) = dVar15 * 100.0 + 0.0;
      lVar14 = lVar14 + 1;
      uVar12 = (long)local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
                     super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x10;
    } while (lVar14 < (int)(uVar12 >> 4));
    uVar8 = (long)uVar12 >> 4;
  }
  ppVar6 = local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppVar10 = local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar9 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<pairing*,std::vector<pairing,std::allocator<pairing>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<randomizeNotes(std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>&)::__0>>
              (local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)uVar12 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<pairing*,std::vector<pairing,std::allocator<pairing>>>,__gnu_cxx::__ops::_Iter_comp_iter<randomizeNotes(std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>&)::__0>>
                (ppVar10,ppVar6);
    }
    else {
      ppVar13 = ppVar10 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<pairing*,std::vector<pairing,std::allocator<pairing>>>,__gnu_cxx::__ops::_Iter_comp_iter<randomizeNotes(std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>&)::__0>>
                (ppVar10,ppVar13);
      for (; ppVar13 != ppVar6; ppVar13 = ppVar13 + 1) {
        iVar4 = ppVar13->index;
        uVar5 = *(undefined4 *)&ppVar13->field_0x4;
        dVar15 = ppVar13->value;
        ppVar10 = ppVar13;
        ppVar11 = ppVar13;
        if (ppVar13[-1].value <= dVar15 && dVar15 != ppVar13[-1].value) {
          do {
            ppVar10 = ppVar11 + -1;
            uVar3 = *(undefined4 *)&ppVar11[-1].field_0x4;
            dVar1 = ppVar11[-1].value;
            ppVar11->index = ppVar11[-1].index;
            *(undefined4 *)&ppVar11->field_0x4 = uVar3;
            ppVar11->value = dVar1;
            ppVar2 = ppVar11 + -2;
            ppVar11 = ppVar10;
          } while (ppVar2->value <= dVar15 && dVar15 != ppVar2->value);
        }
        ppVar10->index = iVar4;
        *(undefined4 *)&ppVar10->field_0x4 = uVar5;
        ppVar10->value = dVar15;
      }
    }
  }
  notes_00 = local_2748;
  uVar7 = (uint)local_2750;
  if (0 < (int)uVar7) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      swapNotes(notes_00,(int)uVar8,
                *(int *)((long)&(local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->index + lVar9));
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while ((uVar7 & 0x7fffffff) != uVar8);
  }
  if (local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2768.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void randomizeNotes(vector<MidiEvent*>& notes) {
   random_device rd;
   mt19937 md(rd());
   uniform_real_distribution<double> dist(0, 100);
   int count = (int)notes.size();
   vector<pairing> neworder;
   neworder.resize(notes.size());
   int i;
   for (i=0; i<(int)neworder.size(); i++) {
      neworder[i].index = i;
      neworder[i].value = dist(md);
   }
   sort(neworder.begin(), neworder.end(),
      [](const pairing& a, const pairing& b) {
         return a.value > b.value;
      });

   for (i=0; i<count; i++) {
      swapNotes(notes, i, neworder[i].index);
   }
}